

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O1

bool __thiscall amrex::Amr::writePlotNow(Amr *this)

{
  double dVar1;
  undefined1 uVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  
  dVar4 = this->plot_per;
  bVar3 = false;
  if (0.0 < dVar4) {
    dVar1 = this->cumtime;
    dVar5 = dVar1 - *(this->dt_level).super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
    auVar6._8_8_ = dVar5;
    auVar6._0_8_ = dVar1;
    auVar7._8_4_ = SUB84(dVar4,0);
    auVar7._0_8_ = dVar4;
    auVar7._12_4_ = (int)((ulong)dVar4 >> 0x20);
    auVar7 = divpd(auVar6,auVar7);
    iVar8 = (int)auVar7._0_8_;
    iVar9 = (int)auVar7._8_8_;
    dVar4 = (double)(iVar9 + 1) * dVar4;
    if ((iVar8 == iVar9) && (ABS(dVar1 - dVar4) <= ABS(dVar1) * 2.220446049250313e-15)) {
      iVar8 = iVar8 + 1;
    }
    if ((iVar8 != iVar9) && (ABS(dVar5 - dVar4) <= ABS(dVar1) * 2.220446049250313e-15)) {
      iVar9 = iVar9 + 1;
    }
    bVar3 = iVar9 != iVar8;
  }
  if (0.0 < this->plot_log_per) {
    dVar4 = *(this->dt_level).super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    iVar9 = 0;
    iVar8 = 0;
    if (dVar4 < this->cumtime) {
      dVar4 = log10(this->cumtime - dVar4);
      iVar8 = (int)(dVar4 / this->plot_log_per);
    }
    if (0.0 < this->cumtime) {
      dVar4 = log10(this->cumtime);
      iVar9 = (int)(dVar4 / this->plot_log_per);
    }
    if (iVar8 != iVar9) {
      bVar3 = true;
    }
  }
  if (this->plot_int < 1) {
    if (bVar3) {
      return (bool)1;
    }
  }
  else {
    if (bVar3) {
      return (bool)1;
    }
    if (*(this->level_steps).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start %
        this->plot_int == 0) {
      return (bool)1;
    }
  }
  uVar2 = (**(code **)(*(long *)(((this->amr_level).
                                  super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                  .
                                  super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                      + 0x138))();
  return (bool)uVar2;
}

Assistant:

bool
Amr::writePlotNow() noexcept
{
    int plot_test = 0;
    if (plot_per > 0.0)
    {

        // Check to see if we've crossed a plot_per interval by comparing
        // the number of intervals that have elapsed for both the current
        // time and the time at the beginning of this timestep.

        int num_per_old = static_cast<int>((cumtime-dt_level[0]) / plot_per);
        int num_per_new = static_cast<int>((cumtime            ) / plot_per);

        // Before using these, however, we must test for the case where we're
        // within machine epsilon of the next interval. In that case, increment
        // the counter, because we have indeed reached the next plot_per interval
        // at this point.

        const Real eps = std::numeric_limits<Real>::epsilon() * 10.0_rt * std::abs(cumtime);
        const Real next_plot_time = (num_per_old + 1) * plot_per;

        if ((num_per_new == num_per_old) && std::abs(cumtime - next_plot_time) <= eps)
        {
            num_per_new += 1;
        }

        // Similarly, we have to account for the case where the old time is within
        // machine epsilon of the beginning of this interval, so that we don't double
        // count that time threshold -- we already plotted at that time on the last timestep.

        if ((num_per_new != num_per_old) && std::abs((cumtime - dt_level[0]) - next_plot_time) <= eps)
        {
            num_per_old += 1;
        }

        if (num_per_old != num_per_new)
        {
            plot_test = 1;
        }

    }

    if (plot_log_per > 0.0)
    {

        // Check to see if we've crossed a plot_log_per interval by comparing
        // the number of intervals that have elapsed for both the current
        // time and the time at the beginning of this timestep.
        // This only works when cumtime > 0.

        int num_per_old = 0;
        int num_per_new = 0;

        if (cumtime-dt_level[0] > 0.) {
            num_per_old = static_cast<int>(std::log10(cumtime-dt_level[0]) / plot_log_per);
        }
        if (cumtime > 0.) {
            num_per_new = static_cast<int>(std::log10(cumtime) / plot_log_per);
        }

        if (num_per_old != num_per_new)
        {
            plot_test = 1;
        }

    }

    return ( (plot_int > 0 && level_steps[0] % plot_int == 0) ||
              plot_test == 1 ||
              amr_level[0]->writePlotNow());
}